

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

void __thiscall
gl4cts::FunctionObject::unary<double,_tcu::Matrix<double,_4,_4>_>::call
          (unary<double,_tcu::Matrix<double,_4,_4>_> *this,GLvoid *result_dst,GLvoid *argument_src)

{
  undefined4 *puVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 *puVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Matrix<double,_4,_4> arg;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  puVar10 = &local_88;
  local_18 = 0;
  uStack_10 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  lVar11 = 0;
  lVar12 = 0;
  do {
    lVar13 = 0;
    do {
      uVar14 = 0x3ff00000;
      if (lVar11 != lVar13) {
        uVar14 = 0;
      }
      *(ulong *)((long)puVar10 + lVar13) = (ulong)uVar14 << 0x20;
      lVar13 = lVar13 + 0x20;
    } while (lVar13 != 0x80);
    lVar12 = lVar12 + 1;
    puVar10 = (undefined8 *)((long)puVar10 + 8);
    lVar11 = lVar11 + 0x20;
  } while (lVar12 != 4);
  lVar11 = 0;
  do {
    puVar1 = (undefined4 *)((long)argument_src + lVar11);
    uVar3 = *puVar1;
    uVar4 = puVar1[1];
    uVar5 = puVar1[2];
    uVar6 = puVar1[3];
    puVar1 = (undefined4 *)((long)argument_src + lVar11 + 0x10);
    uVar7 = puVar1[1];
    uVar8 = puVar1[2];
    uVar9 = puVar1[3];
    *(undefined4 *)((long)&local_78 + lVar11) = *puVar1;
    *(undefined4 *)((long)&local_78 + lVar11 + 4) = uVar7;
    *(undefined4 *)((long)&uStack_70 + lVar11) = uVar8;
    *(undefined4 *)((long)&uStack_70 + lVar11 + 4) = uVar9;
    *(undefined4 *)((long)&local_88 + lVar11) = uVar3;
    *(undefined4 *)((long)&local_88 + lVar11 + 4) = uVar4;
    *(undefined4 *)((long)&uStack_80 + lVar11) = uVar5;
    *(undefined4 *)((long)&uStack_80 + lVar11 + 4) = uVar6;
    lVar11 = lVar11 + 0x20;
  } while (lVar11 != 0x80);
  uVar2 = (*(code *)(this->super_unaryBase).super_functionObject.m_p_function)(&local_88);
  *(undefined8 *)result_dst = uVar2;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		ResT result;
		ArgT arg;

		unpack<ArgT>::get(argument_src, arg);

		functionPointer p_function = (functionPointer)m_p_function;

		result = p_function(arg);

		pack<ResT>::set(result_dst, result);
	}